

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

string * __thiscall
iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *actual,char *matcher_str,
          AssertionResult *ar)

{
  ostream *poVar1;
  char *pcVar2;
  undefined1 local_1b0 [8];
  iu_global_format_stringstream strm;
  AssertionResult *ar_local;
  char *matcher_str_local;
  char *actual_local;
  
  strm.super_iu_stringstream._384_8_ = matcher_str;
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  poVar1 = std::operator<<((ostream *)&strm.super_iu_stringstream.field_0x8,"error: Expected: ");
  poVar1 = std::operator<<(poVar1,actual);
  poVar1 = std::operator<<(poVar1,"\n  Actual: ");
  poVar1 = std::operator<<(poVar1,(char *)this);
  poVar1 = std::operator<<(poVar1,"\nWhich is: ");
  pcVar2 = AssertionResult::message((AssertionResult *)strm.super_iu_stringstream._384_8_);
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringstream::str();
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string MatcherAssertionFailureMessage(const char* actual, const char* matcher_str
                                                    , const AssertionResult& ar)
{
    iu_global_format_stringstream strm;
    strm << "error: Expected: " << matcher_str
        << "\n  Actual: " << actual
        << "\nWhich is: " << ar.message();
    return strm.str();
}